

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,char *type,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  NetPrivate *pNVar1;
  pointer poVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  overwrite_builtin_layer_registry_entry entry;
  
  entry.typeindex = layer_to_index(type);
  entry.creator = creator;
  entry.destroyer = destroyer;
  entry.userdata = userdata;
  if (entry.typeindex == 0xffffffff) {
    iVar4 = (*this->_vptr_Net[2])(this,type);
    if (iVar4 == -1) {
      entry._0_8_ = type;
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::push_back(&this->d->custom_layer_registry,(value_type *)&entry);
    }
    else {
      fprintf(_stderr,"overwrite existing custom layer type %s",type);
      fputc(10,_stderr);
      pcVar3 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3[iVar4].name = type;
      pcVar3[iVar4].creator = creator;
      pcVar3[iVar4].destroyer = destroyer;
      pcVar3[iVar4].userdata = userdata;
    }
  }
  else {
    lVar6 = 0;
    fprintf(_stderr,"overwrite built-in layer type %s",type);
    fputc(10,_stderr);
    pNVar1 = this->d;
    poVar2 = (pNVar1->overwrite_builtin_layer_registry).
             super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(pNVar1->overwrite_builtin_layer_registry).
                  super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)poVar2 >> 5;
    while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
      if (*(uint *)((long)&poVar2->typeindex + lVar6) == entry.typeindex) {
        fprintf(_stderr,"overwrite existing overwritten built-in layer index %d",
                (ulong)(uint)entry.typeindex);
        fputc(10,_stderr);
        poVar2 = (this->d->overwrite_builtin_layer_registry).
                 super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(layer_creator_func *)((long)&poVar2->creator + lVar6) = creator;
        *(layer_destroyer_func *)((long)&poVar2->destroyer + lVar6) = destroyer;
        *(void **)((long)&poVar2->userdata + lVar6) = userdata;
        return 0;
      }
      lVar6 = lVar6 + 0x20;
    }
    std::
    vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
    ::push_back(&pNVar1->overwrite_builtin_layer_registry,&entry);
  }
  return 0;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        NCNN_LOGE("overwrite built-in layer type %s", type);

        for (size_t i = 0; i < d->overwrite_builtin_layer_registry.size(); i++)
        {
            if (d->overwrite_builtin_layer_registry[i].typeindex == typeindex)
            {
                NCNN_LOGE("overwrite existing overwritten built-in layer index %d", typeindex);

                d->overwrite_builtin_layer_registry[i].creator = creator;
                d->overwrite_builtin_layer_registry[i].destroyer = destroyer;
                d->overwrite_builtin_layer_registry[i].userdata = userdata;
                return 0;
            }
        }

        struct overwrite_builtin_layer_registry_entry entry = {typeindex, creator, destroyer, userdata};
        d->overwrite_builtin_layer_registry.push_back(entry);
        return 0;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct custom_layer_registry_entry entry = {type, creator, destroyer, userdata};
        d->custom_layer_registry.push_back(entry);
    }
    else
    {
        NCNN_LOGE("overwrite existing custom layer type %s", type);
        d->custom_layer_registry[custom_index].name = type;
        d->custom_layer_registry[custom_index].creator = creator;
        d->custom_layer_registry[custom_index].destroyer = destroyer;
        d->custom_layer_registry[custom_index].userdata = userdata;
    }

    return 0;
}